

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codegen.cpp
# Opt level: O0

statement_base * __thiscall
cs::method_return_no_value::translate
          (method_return_no_value *this,context_t *context,
          deque<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
          *raw)

{
  token_value *this_00;
  iterator tree_00;
  statement_base *this_01;
  tree_type<cs::token_base_*> tree;
  tree_type<cs::token_base_*> *in_stack_ffffffffffffff58;
  size_t in_stack_ffffffffffffff60;
  pointer *in_stack_ffffffffffffff68;
  __shared_count<(__gnu_cxx::_Lock_policy)2> in_stack_ffffffffffffff98;
  context_t *in_stack_ffffffffffffffa0;
  undefined7 in_stack_ffffffffffffffb0;
  undefined1 uVar1;
  token_value **in_stack_ffffffffffffffb8;
  iterator in_stack_ffffffffffffffc8;
  tree_type<cs::token_base_*> local_20 [4];
  
  tree_type<cs::token_base_*>::tree_type(local_20);
  tree_type<cs::token_base_*>::root(in_stack_ffffffffffffff58);
  this_00 = (token_value *)token_base::operator_new(in_stack_ffffffffffffff60);
  cs_impl::any::any<cs::pointer>((any *)this_00,in_stack_ffffffffffffff68);
  token_value::token_value(this_00,&in_stack_ffffffffffffff68->data);
  uVar1 = 0;
  tree_00 = tree_type<cs::token_base*>::emplace_root_left<cs::token_value*>
                      ((tree_type<cs::token_base_*> *)this_00,in_stack_ffffffffffffffc8,
                       in_stack_ffffffffffffffb8);
  cs_impl::any::~any((any *)0x23f79d);
  this_01 = (statement_base *)statement_base::operator_new(in_stack_ffffffffffffff60);
  tree_type<cs::token_base_*>::tree_type
            ((tree_type<cs::token_base_*> *)this_01,in_stack_ffffffffffffff58);
  std::shared_ptr<cs::context_type>::shared_ptr
            ((shared_ptr<cs::context_type> *)this_01,
             (shared_ptr<cs::context_type> *)&stack0xffffffffffffff90);
  std::
  deque<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
  ::front((deque<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
           *)this_00);
  std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>::back
            ((deque<cs::token_base_*,_std::allocator<cs::token_base_*>_> *)this_00);
  statement_return::statement_return
            ((statement_return *)CONCAT17(uVar1,in_stack_ffffffffffffffb0),
             (tree_type<cs::token_base_*> *)tree_00.mData,in_stack_ffffffffffffffa0,
             (token_base *)in_stack_ffffffffffffff98._M_pi);
  std::shared_ptr<cs::context_type>::~shared_ptr((shared_ptr<cs::context_type> *)0x23f819);
  tree_type<cs::token_base_*>::~tree_type((tree_type<cs::token_base_*> *)0x23f823);
  tree_type<cs::token_base_*>::~tree_type((tree_type<cs::token_base_*> *)0x23f830);
  return this_01;
}

Assistant:

statement_base *
	method_return_no_value::translate(const context_t &context, const std::deque<std::deque<token_base *>> &raw)
	{
		tree_type<token_base *> tree;
		tree.emplace_root_left(tree.root(), new token_value(null_pointer));
		return new statement_return(tree, context, raw.front().back());
	}